

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

iterator LowerBound(ImVector<ImGuiStorage::Pair> *data,ImGuiID key)

{
  iterator pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  pvVar1 = data->Data;
  uVar3 = (long)data->Size;
  while (uVar2 = uVar3, uVar2 != 0) {
    uVar3 = uVar2 >> 1;
    if (pvVar1[uVar3].key < key) {
      pvVar1 = pvVar1 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar2;
    }
  }
  return pvVar1;
}

Assistant:

inline iterator             begin()                         { return Data; }